

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O2

void __thiscall AssemblyCode::PatternMatcher::PatternMatcher(PatternMatcher *this)

{
  shared_ptr<IRT::CallPattern> local_20;
  
  (this->patterns).
  super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->patterns).
  super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->patterns).
  super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::make_shared<IRT::MoveFromMemByRegToReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveFromMemByRegToReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveFromMemByRegToReg> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MemFromRegPlusConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromRegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromRegPlusConstPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MemFromConstPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromConstPlusRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveFromMemByRegToMemByReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveFromMemByRegToMemByReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveFromMemByRegToMemByReg> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveRegToMemByRegPlusConst>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByRegPlusConst>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByRegPlusConst> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveRegToMemByConstPlusReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByConstPlusReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByConstPlusReg> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveRegToMemByReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByReg> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveRegToMemByConst>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByConst>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByConst> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MemFromConstPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromConstPlusRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MemFromRegPlusConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromRegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromRegPlusConstPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveMemFromConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveMemFromConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveMemFromConstPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::RegPlusConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegPlusConstPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::ConstPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ConstPlusRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::CallPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::CallPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::ConditionalJumpPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConditionalJumpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ConditionalJumpPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MoveRegRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::RegPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegPlusRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::RegMinusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegMinusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegMinusRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::RegMulRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegMulRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegMulRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::RegModRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegModRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegModRegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::JumpPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::JumpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::JumpPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::ExpPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ExpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ExpPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::NamePattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::NamePattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::NamePattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::LabelPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::LabelPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::LabelPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::ConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ConstPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::MemPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<IRT::RegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegPattern> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

AssemblyCode::PatternMatcher::PatternMatcher( ) {
    patterns.emplace_back( std::make_shared<IRT::MoveFromMemByRegToReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromRegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveFromMemByRegToMemByReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByRegPlusConst>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByConstPlusReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByConst>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromRegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveMemFromConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::CallPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConditionalJumpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegMinusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegMulRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegModRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::JumpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ExpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::NamePattern>( ));
    patterns.emplace_back( std::make_shared<IRT::LabelPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPattern>( ));
}